

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleTable::parent(QAccessibleTable *this)

{
  int iVar1;
  QAbstractItemView *pQVar2;
  QObject *pQVar3;
  char *pcVar4;
  QAccessibleInterface *pQVar5;
  QCoreApplication *pQVar6;
  
  pQVar2 = view((QAccessibleTable *)0x7f5f1b);
  if (pQVar2 != (QAbstractItemView *)0x0) {
    view((QAccessibleTable *)0x7f5f2e);
    pQVar3 = QObject::parent((QObject *)0x7f5f36);
    if (pQVar3 != (QObject *)0x0) {
      view((QAccessibleTable *)0x7f5f45);
      pQVar3 = QObject::parent((QObject *)0x7f5f4d);
      (*(code *)**(undefined8 **)pQVar3)();
      pcVar4 = (char *)QMetaObject::className();
      iVar1 = qstrcmp("QComboBoxPrivateContainer",pcVar4);
      if (iVar1 == 0) {
        view((QAccessibleTable *)0x7f5f7a);
        QObject::parent((QObject *)0x7f5f82);
        pQVar3 = QObject::parent((QObject *)0x7f5f8a);
        pQVar5 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar3);
        return pQVar5;
      }
      view((QAccessibleTable *)0x7f5fa2);
      pQVar3 = QObject::parent((QObject *)0x7f5faa);
      pQVar5 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar3);
      return pQVar5;
    }
  }
  pQVar6 = QCoreApplication::instance();
  pQVar5 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface((QObject *)pQVar6);
  return pQVar5;
}

Assistant:

QAccessibleInterface *QAccessibleTable::parent() const
{
    if (view() && view()->parent()) {
        if (qstrcmp("QComboBoxPrivateContainer", view()->parent()->metaObject()->className()) == 0) {
            return QAccessible::queryAccessibleInterface(view()->parent()->parent());
        }
        return QAccessible::queryAccessibleInterface(view()->parent());
    }
    return QAccessible::queryAccessibleInterface(qApp);
}